

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharing.c
# Opt level: O0

share_forwarding * share_add_forwarding(ssh_sharing_connstate *cs,char *host,int port)

{
  char *pcVar1;
  ssh_sharing_connstate *psVar2;
  share_forwarding *fwd;
  int port_local;
  char *host_local;
  ssh_sharing_connstate *cs_local;
  
  cs_local = (ssh_sharing_connstate *)safemalloc(1,0x18,0);
  pcVar1 = dupstr(host);
  *(char **)cs_local = pcVar1;
  *(int *)&cs_local->sock = port;
  *(undefined1 *)((long)&cs_local->sock + 4) = 0;
  psVar2 = (ssh_sharing_connstate *)add234(cs->forwardings,cs_local);
  if (psVar2 != cs_local) {
    safefree(cs_local);
    cs_local = (ssh_sharing_connstate *)0x0;
  }
  return (share_forwarding *)cs_local;
}

Assistant:

static struct share_forwarding *share_add_forwarding
    (struct ssh_sharing_connstate *cs,
     const char *host, int port)
{
    struct share_forwarding *fwd = snew(struct share_forwarding);
    fwd->host = dupstr(host);
    fwd->port = port;
    fwd->active = false;
    if (add234(cs->forwardings, fwd) != fwd) {
        /* Duplicate?! */
        sfree(fwd);
        return NULL;
    }
    return fwd;
}